

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  TargetType targetType;
  int iVar6;
  cmGeneratorTarget *pcVar7;
  cmLocalNinjaGenerator *pcVar8;
  undefined4 extraout_var;
  char *pcVar9;
  string *psVar10;
  ulong uVar11;
  cmMakefile *this_00;
  reference __rhs;
  cmGlobalNinjaGenerator *pcVar12;
  reference pvVar13;
  iterator end;
  pointer pcVar14;
  cmOutputConverter *local_1318;
  string *local_1150;
  cmOutputConverter *local_10c0;
  string local_1010;
  string local_ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd0;
  reference local_fb0;
  string *i_2;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  string local_f50;
  reference local_f30;
  string *i_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f08;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f00;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_ef0;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range3;
  undefined1 local_ec8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_ea8;
  string local_e88;
  allocator<char> local_e61;
  string local_e60;
  string local_e40;
  allocator<char> local_e19;
  string local_e18;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70 [8];
  string run_iwyu;
  char *cppcheck;
  string cppcheck_prop;
  char *cpplint;
  string cpplint_prop;
  char *tidy;
  string tidy_prop;
  char *iwyu;
  string iwyu_prop;
  char *clauncher;
  string clauncher_prop;
  string compilerLauncher;
  string *compileCmd_1;
  undefined1 local_c40 [8];
  string cmdVar_1;
  string *compileCmd;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  undefined1 local_bc8 [8];
  string cmdVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  allocator<char> local_b69;
  string local_b68;
  undefined1 local_b48 [8];
  string depfileFlags;
  string flagsName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  byte local_a1b;
  byte local_a1a;
  allocator<char> local_a19;
  string local_a18;
  byte local_9f3;
  byte local_9f2;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  undefined1 local_9a8 [8];
  string cl;
  string local_968 [8];
  string cldeps;
  string local_928;
  undefined1 local_908 [8];
  cmNinjaRule rule;
  string local_7c0;
  undefined1 local_7a0 [8];
  string ccmd_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  undefined1 local_748 [8];
  cmNinjaRule rule_2;
  string local_600;
  undefined1 local_5e0 [8];
  string ccmd;
  string *i;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string ppVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  string local_528 [8];
  string ppFlags;
  RuleVariables ppVars;
  undefined1 local_3d8 [8];
  cmNinjaRule rule_1;
  string cmakeCmd;
  string local_288;
  char *local_268;
  char *val;
  string launcher;
  string local_220;
  undefined1 local_200 [8];
  string tdi;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  undefined1 local_1b8 [8];
  string responseFlagVar;
  undefined1 local_190 [7];
  bool lang_supports_response;
  string responseFlag;
  allocator<char> local_159;
  string local_158 [8];
  string flags;
  cmMakefile *mf;
  undefined1 auStack_128 [6];
  bool needDyndep;
  bool explicitPP;
  RuleVariables vars;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  vars.SwiftSources = (char *)lang;
  cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)auStack_128);
  pcVar7 = GetGeneratorTarget(this);
  cmGeneratorTarget::GetName_abi_cxx11_(pcVar7);
  _auStack_128 = (char *)std::__cxx11::string::c_str();
  pcVar7 = GetGeneratorTarget(this);
  targetType = cmGeneratorTarget::GetType(pcVar7);
  vars.CMTargetName = cmState::GetTargetTypeName(targetType);
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.LinkLibraries = "$in";
  vars.Output = "$out";
  vars.LanguageCompileFlags = "$DEFINES";
  vars.Defines = "$INCLUDES";
  vars.CMTargetType = "$TARGET_PDB";
  vars.TargetPDB = "$TARGET_COMPILE_PDB";
  vars.Object = "$OBJECT_DIR";
  vars.ObjectDir = "$OBJECT_FILE_DIR";
  bVar3 = NeedExplicitPreprocessing(this,(string *)vars.SwiftSources);
  bVar4 = NeedDyndep(this,(string *)vars.SwiftSources);
  flags.field_2._8_8_ = GetMakefile(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"$FLAGS",&local_159);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::string((string *)local_190);
  responseFlagVar.field_2._M_local_buf[0xf] =
       std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vars.SwiftSources,"RC");
  if (((bool)responseFlagVar.field_2._M_local_buf[0xf]) && (bVar5 = ForceResponseFile(this), bVar5))
  {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rulePlaceholderExpander,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rulePlaceholderExpander,"_RESPONSE_FILE_FLAG");
    std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
    psVar10 = cmMakefile::GetSafeDefinition
                        ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_1b8);
    std::__cxx11::string::operator=((string *)local_190,(string *)psVar10);
    uVar11 = std::__cxx11::string::empty();
    if (((uVar11 & 1) != 0) &&
       (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vars.SwiftSources,"CUDA"), bVar5)) {
      std::__cxx11::string::operator=((string *)local_190,"@");
    }
    std::__cxx11::string::~string((string *)local_1b8);
  }
  pcVar8 = GetLocalGenerator(this);
  iVar6 = (*(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    ();
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )(tdi.field_2._M_local_buf + 8),(pointer)CONCAT44(extraout_var,iVar6));
  pcVar8 = GetLocalGenerator(this);
  GetTargetDependInfoPath((string *)((long)&launcher.field_2 + 8),this,(string *)vars.SwiftSources);
  ConvertToNinjaPath(&local_220,this,(string *)((long)&launcher.field_2 + 8));
  cmOutputConverter::ConvertToOutputFormat
            ((string *)local_200,
             &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_220,SHELL);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&val);
  pcVar8 = GetLocalGenerator(this);
  pcVar7 = GetGeneratorTarget(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"RULE_LAUNCH_COMPILE",
             (allocator<char> *)(cmakeCmd.field_2._M_local_buf + 0xf));
  pcVar9 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar8,pcVar7,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)(cmakeCmd.field_2._M_local_buf + 0xf));
  local_268 = pcVar9;
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    std::__cxx11::string::operator=((string *)&val,pcVar9);
    std::__cxx11::string::operator+=((string *)&val," ");
  }
  pcVar8 = GetLocalGenerator(this);
  psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmOutputConverter::ConvertToOutputFormat
            ((string *)&rule_1.Generator,
             &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             psVar10,SHELL);
  if (bVar3) {
    LanguagePreprocessRule((string *)&ppVars.SwiftSources,this,(string *)vars.SwiftSources);
    cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_3d8,(string *)&ppVars.SwiftSources);
    std::__cxx11::string::~string((string *)&ppVars.SwiftSources);
    std::__cxx11::string::operator=((string *)(rule_1.DepFile.field_2._M_local_buf + 8),"");
    std::__cxx11::string::operator=((string *)(rule_1.Comment.field_2._M_local_buf + 8),"$DEP_FILE")
    ;
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&ppFlags.field_2 + 8));
    ppFlags.field_2._8_8_ = _auStack_128;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.TargetVersionMinor = vars.TargetVersionMinor;
    ppVars.Output = "$out";
    ppVars.AssemblySource = "$out";
    ppVars.Includes = (char *)std::__cxx11::string::c_str();
    ppVars.LinkLibraries = vars.LinkLibraries;
    vars.LinkLibraries = "$in";
    std::__cxx11::string::string(local_528,local_158);
    ppVars.LanguageCompileFlags = vars.LanguageCompileFlags;
    vars.LanguageCompileFlags = "";
    ppVars.Defines = vars.Defines;
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)(rule_1.DepType.field_2._M_local_buf + 8),"$RSP_FILE");
      std::__cxx11::string::operator=((string *)(rule_1.RspFile.field_2._M_local_buf + 8)," ");
      std::__cxx11::string::operator+=
                ((string *)(rule_1.RspFile.field_2._M_local_buf + 8),ppVars.LanguageCompileFlags);
      std::__cxx11::string::operator+=((string *)(rule_1.RspFile.field_2._M_local_buf + 8)," ");
      std::__cxx11::string::operator+=
                ((string *)(rule_1.RspFile.field_2._M_local_buf + 8),ppVars.Defines);
      std::__cxx11::string::operator+=((string *)(rule_1.RspFile.field_2._M_local_buf + 8)," ");
      std::__cxx11::string::operator+=
                ((string *)(rule_1.RspFile.field_2._M_local_buf + 8),local_528);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ppCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&rule_1.DepType.field_2 + 8));
      std::__cxx11::string::operator=
                (local_528,
                 (string *)
                 &ppCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &ppCmds.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ppVars.LanguageCompileFlags = "";
      ppVars.Defines = "";
    }
    ppVars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&ppVar.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            vars.SwiftSources);
    std::__cxx11::string::operator+=((string *)&__range2,"_PREPROCESS_SOURCE");
    this_00 = GetMakefile(this);
    psVar10 = cmMakefile::GetRequiredDefinition(this_00,(string *)&__range2);
    cmSystemTools::ExpandListArgument
              (psVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&ppVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)&__range2);
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&ppVar.field_2 + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar1);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar1);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar5) {
      __rhs = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ccmd.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,__rhs
                    );
      std::__cxx11::string::operator=((string *)__rhs,(string *)(ccmd.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(ccmd.field_2._M_local_buf + 8));
      pcVar14 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)((long)&tdi.field_2 + 8));
      pcVar8 = GetLocalGenerator(this);
      local_10c0 = (cmOutputConverter *)0x0;
      if (pcVar8 != (cmLocalNinjaGenerator *)0x0) {
        local_10c0 = &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (pcVar14,local_10c0,__rhs,(RuleVariables *)((long)&ppFlags.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::string((string *)local_5e0,(string *)&rule_1.Generator);
    std::__cxx11::string::operator+=((string *)local_5e0," -E cmake_ninja_depends --tdi=");
    std::__cxx11::string::operator+=((string *)local_5e0,(string *)local_200);
    std::__cxx11::string::operator+=((string *)local_5e0," --lang=");
    std::__cxx11::string::operator+=((string *)local_5e0,(string *)vars.SwiftSources);
    std::__cxx11::string::operator+=((string *)local_5e0," --pp=$out --dep=$DEP_FILE");
    if (bVar4) {
      std::__cxx11::string::operator+=
                ((string *)local_5e0," --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE");
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (ppVar.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
    std::__cxx11::string::~string((string *)local_5e0);
    pcVar8 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&rule_2.Generator);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_600,pcVar8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&ppVar.field_2 + 8),(string *)&rule_2.Generator,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule_1.Name.field_2._M_local_buf + 8),(string *)&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&rule_2.Generator);
    std::__cxx11::string::operator=
              ((string *)(rule_1.Description.field_2._M_local_buf + 8),"Rule for preprocessing ");
    std::__cxx11::string::operator+=
              ((string *)(rule_1.Description.field_2._M_local_buf + 8),(string *)vars.SwiftSources);
    std::__cxx11::string::operator+=
              ((string *)(rule_1.Description.field_2._M_local_buf + 8)," files.");
    std::__cxx11::string::operator=((string *)(rule_1.Command.field_2._M_local_buf + 8),"Building ")
    ;
    std::__cxx11::string::operator+=
              ((string *)(rule_1.Command.field_2._M_local_buf + 8),(string *)vars.SwiftSources);
    std::__cxx11::string::operator+=
              ((string *)(rule_1.Command.field_2._M_local_buf + 8)," preprocessed $out");
    pcVar12 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar12,(cmNinjaRule *)local_3d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&ppVar.field_2 + 8));
    std::__cxx11::string::~string(local_528);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_3d8);
  }
  if (bVar4) {
    LanguageDyndepRule((string *)
                       &ddCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                       (string *)vars.SwiftSources);
    cmNinjaRule::cmNinjaRule
              ((cmNinjaRule *)local_748,
               (string *)
               &ddCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &ddCmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator=((string *)(rule_2.DepType.field_2._M_local_buf + 8),"$out.rsp");
    std::__cxx11::string::operator=((string *)(rule_2.RspFile.field_2._M_local_buf + 8),"$in");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&ccmd_1.field_2 + 8));
    std::__cxx11::string::string((string *)local_7a0,(string *)&rule_1.Generator);
    std::__cxx11::string::operator+=((string *)local_7a0," -E cmake_ninja_dyndep --tdi=");
    std::__cxx11::string::operator+=((string *)local_7a0,(string *)local_200);
    std::__cxx11::string::operator+=((string *)local_7a0," --lang=");
    std::__cxx11::string::operator+=((string *)local_7a0,(string *)vars.SwiftSources);
    std::__cxx11::string::operator+=((string *)local_7a0," --dd=$out ");
    std::__cxx11::string::operator+=((string *)local_7a0,"@");
    std::__cxx11::string::operator+=
              ((string *)local_7a0,(string *)(rule_2.DepType.field_2._M_local_buf + 8));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (ccmd_1.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0);
    std::__cxx11::string::~string((string *)local_7a0);
    pcVar8 = GetLocalGenerator(this);
    std::__cxx11::string::string((string *)&rule.Generator);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_7c0,pcVar8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&ccmd_1.field_2 + 8),(string *)&rule.Generator,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule_2.Name.field_2._M_local_buf + 8),(string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&rule.Generator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&ccmd_1.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(rule_2.Description.field_2._M_local_buf + 8),
               "Rule to generate ninja dyndep files for ");
    std::__cxx11::string::operator+=
              ((string *)(rule_2.Description.field_2._M_local_buf + 8),(string *)vars.SwiftSources);
    std::__cxx11::string::operator+=((string *)(rule_2.Description.field_2._M_local_buf + 8),".");
    std::__cxx11::string::operator=
              ((string *)(rule_2.Command.field_2._M_local_buf + 8),"Generating ");
    std::__cxx11::string::operator+=
              ((string *)(rule_2.Command.field_2._M_local_buf + 8),(string *)vars.SwiftSources);
    std::__cxx11::string::operator+=
              ((string *)(rule_2.Command.field_2._M_local_buf + 8)," dyndep file $out");
    pcVar12 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar12,(cmNinjaRule *)local_748);
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_748);
  }
  LanguageCompilerRule(&local_928,this,(string *)vars.SwiftSources);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_908,&local_928);
  std::__cxx11::string::~string((string *)&local_928);
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) == 0) {
    std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE");
    std::__cxx11::string::operator=((string *)(rule.RspFile.field_2._M_local_buf + 8)," ");
    std::__cxx11::string::operator+=
              ((string *)(rule.RspFile.field_2._M_local_buf + 8),vars.LanguageCompileFlags);
    std::__cxx11::string::operator+=((string *)(rule.RspFile.field_2._M_local_buf + 8)," ");
    std::__cxx11::string::operator+=((string *)(rule.RspFile.field_2._M_local_buf + 8),vars.Defines)
    ;
    std::__cxx11::string::operator+=((string *)(rule.RspFile.field_2._M_local_buf + 8)," ");
    std::__cxx11::string::operator+=((string *)(rule.RspFile.field_2._M_local_buf + 8),local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&cldeps.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&rule.DepType.field_2 + 8));
    std::__cxx11::string::operator=(local_158,(string *)(cldeps.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cldeps.field_2._M_local_buf + 8));
    vars.LanguageCompileFlags = "";
    vars.Defines = "";
  }
  std::__cxx11::string::string(local_968);
  if (!bVar3) {
    bVar3 = NeedDepTypeMSVC(this,(string *)vars.SwiftSources);
    uVar2 = flags.field_2._8_8_;
    if (bVar3) {
      std::__cxx11::string::operator=((string *)(rule.DepFile.field_2._M_local_buf + 8),"msvc");
      std::__cxx11::string::clear();
      std::__cxx11::string::operator+=(local_158," /showIncludes");
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&cl.field_2 + 8),"CMAKE_NINJA_CMCLDEPS_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vars.SwiftSources);
      bVar3 = cmMakefile::IsOn((cmMakefile *)uVar2,(string *)((long)&cl.field_2 + 8));
      std::__cxx11::string::~string((string *)(cl.field_2._M_local_buf + 8));
      if (bVar3) {
        bVar3 = cmMakefile::GetIsSourceFileTryCompile((cmMakefile *)flags.field_2._8_8_);
        if (!bVar3) {
          std::__cxx11::string::operator=((string *)(rule.DepFile.field_2._M_local_buf + 8),"gcc");
          std::__cxx11::string::operator=
                    ((string *)(rule.Comment.field_2._M_local_buf + 8),"$DEP_FILE");
          uVar2 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          local_9f2 = 0;
          local_9f3 = 0;
          local_a1a = 0;
          local_a1b = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9c8,"CMAKE_C_COMPILER",&local_9c9);
          pcVar9 = cmMakefile::GetDefinition((cmMakefile *)uVar2,&local_9c8);
          uVar2 = flags.field_2._8_8_;
          if (pcVar9 == (char *)0x0) {
            std::allocator<char>::allocator();
            local_a1a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a18,"CMAKE_CXX_COMPILER",&local_a19);
            local_a1b = 1;
            local_1150 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_a18);
          }
          else {
            std::allocator<char>::allocator();
            local_9f2 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_9f0,"CMAKE_C_COMPILER",&local_9f1);
            local_9f3 = 1;
            local_1150 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_9f0);
          }
          std::__cxx11::string::string((string *)local_9a8,(string *)local_1150);
          if ((local_a1b & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_a18);
          }
          if ((local_a1a & 1) != 0) {
            std::allocator<char>::~allocator(&local_a19);
          }
          if ((local_9f3 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_9f0);
          }
          if ((local_9f2 & 1) != 0) {
            std::allocator<char>::~allocator(&local_9f1);
          }
          std::__cxx11::string::~string((string *)&local_9c8);
          std::allocator<char>::~allocator(&local_9c9);
          std::__cxx11::string::operator=(local_968,"\"");
          psVar10 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
          std::__cxx11::string::operator+=(local_968,(string *)psVar10);
          std::operator+(&local_aa0,"\" ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         vars.SwiftSources);
          std::operator+(&local_a80,&local_aa0," ");
          std::operator+(&local_a60,&local_a80,vars.LinkLibraries);
          std::operator+(&local_a40,&local_a60," $DEP_FILE $out \"");
          std::__cxx11::string::operator+=(local_968,(string *)&local_a40);
          std::__cxx11::string::~string((string *)&local_a40);
          std::__cxx11::string::~string((string *)&local_a60);
          std::__cxx11::string::~string((string *)&local_a80);
          std::__cxx11::string::~string((string *)&local_aa0);
          uVar2 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ac0,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_ac1);
          psVar10 = cmMakefile::GetSafeDefinition((cmMakefile *)uVar2,&local_ac0);
          std::__cxx11::string::operator+=(local_968,(string *)psVar10);
          std::__cxx11::string::~string((string *)&local_ac0);
          std::allocator<char>::~allocator(&local_ac1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flagsName.field_2 + 8),"\" \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_9a8);
          std::operator+(&local_ae8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flagsName.field_2 + 8),"\" ");
          std::__cxx11::string::operator+=(local_968,(string *)&local_ae8);
          std::__cxx11::string::~string((string *)&local_ae8);
          std::__cxx11::string::~string((string *)(flagsName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_9a8);
        }
      }
      else {
        std::__cxx11::string::operator=((string *)(rule.DepFile.field_2._M_local_buf + 8),"gcc");
        std::__cxx11::string::operator=
                  ((string *)(rule.Comment.field_2._M_local_buf + 8),"$DEP_FILE");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&depfileFlags.field_2 + 8),"CMAKE_DEPFILE_FLAGS_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vars.SwiftSources);
        psVar10 = cmMakefile::GetSafeDefinition
                            ((cmMakefile *)flags.field_2._8_8_,
                             (string *)((long)&depfileFlags.field_2 + 8));
        std::__cxx11::string::string((string *)local_b48,(string *)psVar10);
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          cmsys::SystemTools::ReplaceString((string *)local_b48,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString((string *)local_b48,"<OBJECT>","$out");
          uVar2 = flags.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b68,"CMAKE_C_COMPILER",&local_b69);
          pcVar9 = cmMakefile::GetDefinition((cmMakefile *)uVar2,&local_b68);
          cmsys::SystemTools::ReplaceString((string *)local_b48,"<CMAKE_C_COMPILER>",pcVar9);
          std::__cxx11::string::~string((string *)&local_b68);
          std::allocator<char>::~allocator(&local_b69);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &compileCmds.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b48);
          std::__cxx11::string::operator+=
                    (local_158,
                     (string *)
                     &compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::string::~string((string *)local_b48);
        std::__cxx11::string::~string((string *)(depfileFlags.field_2._M_local_buf + 8));
      }
    }
  }
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  vars.Includes = (char *)std::__cxx11::string::c_str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&cmdVar.field_2 + 8));
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          vars.SwiftSources,"CUDA");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_bc8);
    pcVar7 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be8,"CUDA_SEPARABLE_COMPILATION",&local_be9);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar7,&local_be8);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator(&local_be9);
    if (bVar3) {
      std::__cxx11::string::operator=
                ((string *)local_bc8,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    }
    else {
      pcVar7 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c10,"CUDA_PTX_COMPILATION",
                 (allocator<char> *)((long)&compileCmd + 7));
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar7,&local_c10);
      std::__cxx11::string::~string((string *)&local_c10);
      std::allocator<char>::~allocator((allocator<char> *)((long)&compileCmd + 7));
      if (bVar3) {
        std::__cxx11::string::operator=((string *)local_bc8,"CMAKE_CUDA_COMPILE_PTX_COMPILATION");
      }
      else {
        std::__cxx11::string::operator=((string *)local_bc8,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
      }
    }
    cmdVar_1.field_2._8_8_ =
         (size_type)cmMakefile::GetRequiredDefinition(flags.field_2._8_8_,(string *)local_bc8);
    cmSystemTools::ExpandListArgument
              ((string *)cmdVar_1.field_2._8_8_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cmdVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)local_bc8);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compileCmd_1,"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compileCmd_1,"_COMPILE_OBJECT");
    std::__cxx11::string::~string((string *)&compileCmd_1);
    psVar10 = cmMakefile::GetRequiredDefinition
                        ((cmMakefile *)flags.field_2._8_8_,(string *)local_c40);
    cmSystemTools::ExpandListArgument
              (psVar10,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&cmdVar.field_2 + 8),false);
    std::__cxx11::string::~string((string *)local_c40);
  }
  std::__cxx11::string::string((string *)(clauncher_prop.field_2._M_local_buf + 8));
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar3) &&
     ((((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vars.SwiftSources,"C"), bVar3 ||
        (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)vars.SwiftSources,"CXX"), bVar3)) ||
       (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )vars.SwiftSources,"Fortran"), bVar3)) ||
      (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.SwiftSources,"CUDA"), bVar3)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&clauncher,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources,"_COMPILER_LAUNCHER");
    iwyu_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&clauncher);
    if (((char *)iwyu_prop.field_2._8_8_ != (char *)0x0) &&
       (*(char *)iwyu_prop.field_2._8_8_ != '\0')) {
      std::__cxx11::string::operator=
                ((string *)(clauncher_prop.field_2._M_local_buf + 8),(char *)iwyu_prop.field_2._8_8_
                );
    }
    std::__cxx11::string::~string((string *)&clauncher);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if ((!bVar3) &&
     ((bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.SwiftSources,"C"), bVar3 ||
      (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               vars.SwiftSources,"CXX"), bVar3)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iwyu,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources,"_INCLUDE_WHAT_YOU_USE");
    tidy_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&iwyu);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tidy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources,"_CLANG_TIDY");
    cpplint_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&tidy);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cpplint,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources,"_CPPLINT");
    cppcheck_prop.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&cpplint);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cppcheck,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   vars.SwiftSources,"_CPPCHECK");
    run_iwyu.field_2._8_8_ =
         cmGeneratorTarget::GetProperty
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&cppcheck);
    if (((tidy_prop.field_2._8_8_ != 0) && (*(char *)tidy_prop.field_2._8_8_ != '\0')) ||
       ((((cpplint_prop.field_2._8_8_ != 0 && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) ||
         ((cppcheck_prop.field_2._8_8_ != 0 && (*(char *)cppcheck_prop.field_2._8_8_ != '\0')))) ||
        (((char *)run_iwyu.field_2._8_8_ != (char *)0x0 && (*(char *)run_iwyu.field_2._8_8_ != '\0')
         ))))) {
      std::__cxx11::string::string(local_d70,(string *)&rule_1.Generator);
      std::__cxx11::string::operator+=(local_d70," -E __run_co_compile");
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        std::__cxx11::string::operator+=(local_d70," --launcher=");
        cmOutputConverter::EscapeForShell
                  (&local_d90,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)((long)&clauncher_prop.field_2 + 8),false,
                   false,false);
        std::__cxx11::string::operator+=(local_d70,(string *)&local_d90);
        std::__cxx11::string::~string((string *)&local_d90);
        std::__cxx11::string::clear();
      }
      if ((tidy_prop.field_2._8_8_ != 0) && (*(char *)tidy_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=(local_d70," --iwyu=");
        pcVar8 = GetLocalGenerator(this);
        uVar2 = tidy_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_dd0,(char *)uVar2,&local_dd1);
        cmOutputConverter::EscapeForShell
                  (&local_db0,
                   &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_dd0,false,false,false);
        std::__cxx11::string::operator+=(local_d70,(string *)&local_db0);
        std::__cxx11::string::~string((string *)&local_db0);
        std::__cxx11::string::~string((string *)&local_dd0);
        std::allocator<char>::~allocator(&local_dd1);
      }
      if ((cpplint_prop.field_2._8_8_ != 0) && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=(local_d70," --tidy=");
        pcVar8 = GetLocalGenerator(this);
        uVar2 = cpplint_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e18,(char *)uVar2,&local_e19);
        cmOutputConverter::EscapeForShell
                  (&local_df8,
                   &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_e18,false,false,false);
        std::__cxx11::string::operator+=(local_d70,(string *)&local_df8);
        std::__cxx11::string::~string((string *)&local_df8);
        std::__cxx11::string::~string((string *)&local_e18);
        std::allocator<char>::~allocator(&local_e19);
      }
      if ((cppcheck_prop.field_2._8_8_ != 0) && (*(char *)cppcheck_prop.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=(local_d70," --cpplint=");
        pcVar8 = GetLocalGenerator(this);
        uVar2 = cppcheck_prop.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e60,(char *)uVar2,&local_e61);
        cmOutputConverter::EscapeForShell
                  (&local_e40,
                   &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_e60,false,false,false);
        std::__cxx11::string::operator+=(local_d70,(string *)&local_e40);
        std::__cxx11::string::~string((string *)&local_e40);
        std::__cxx11::string::~string((string *)&local_e60);
        std::allocator<char>::~allocator(&local_e61);
      }
      if ((run_iwyu.field_2._8_8_ != 0) && (*(char *)run_iwyu.field_2._8_8_ != '\0')) {
        std::__cxx11::string::operator+=(local_d70," --cppcheck=");
        pcVar8 = GetLocalGenerator(this);
        uVar2 = run_iwyu.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ea8,(char *)uVar2,
                   (allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmOutputConverter::EscapeForShell
                  (&local_e88,
                   &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_ea8,false,false,false);
        std::__cxx11::string::operator+=(local_d70,(string *)&local_e88);
        std::__cxx11::string::~string((string *)&local_e88);
        std::__cxx11::string::~string((string *)&local_ea8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&args.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if ((((cpplint_prop.field_2._8_8_ != 0) && (*(char *)cpplint_prop.field_2._8_8_ != '\0')) ||
          ((cppcheck_prop.field_2._8_8_ != 0 && (*(char *)cppcheck_prop.field_2._8_8_ != '\0')))) ||
         ((run_iwyu.field_2._8_8_ != 0 && (*(char *)run_iwyu.field_2._8_8_ != '\0')))) {
        std::__cxx11::string::operator+=(local_d70," --source=$in");
      }
      std::__cxx11::string::operator+=(local_d70," -- ");
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&cmdVar.field_2 + 8));
      std::__cxx11::string::insert((ulong)pvVar13,(string *)0x0);
      std::__cxx11::string::~string(local_d70);
    }
    std::__cxx11::string::~string((string *)&cppcheck);
    std::__cxx11::string::~string((string *)&cpplint);
    std::__cxx11::string::~string((string *)&tidy);
    std::__cxx11::string::~string((string *)&iwyu);
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if (!bVar3) {
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_ec8);
      cmSystemTools::ExpandListArgument
                ((string *)((long)&clauncher_prop.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ec8,true);
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_ec8);
      if (!bVar3) {
        pcVar8 = this->LocalGenerator;
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_ec8,0);
        cmOutputConverter::ConvertToOutputFormat
                  ((string *)&__range3,
                   &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,pvVar13,SHELL);
        pvVar13 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_ec8,0);
        std::__cxx11::string::operator=((string *)pvVar13,(string *)&__range3);
        std::__cxx11::string::~string((string *)&__range3);
        local_f10._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_ec8);
        local_f08 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_f10,1);
        end = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_ec8);
        local_f00 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (local_f08,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )end._M_current);
        local_ef0 = &local_f00;
        __end3 = cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::begin(local_ef0);
        i_1 = (string *)
              cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::end(local_ef0);
        while( true ) {
          bVar3 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&i_1);
          if (!bVar3) break;
          local_f30 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          cmOutputConverter::EscapeForShell
                    (&local_f50,
                     &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,local_f30,false,false,false);
          std::__cxx11::string::operator=((string *)local_f30,(string *)&local_f50);
          std::__cxx11::string::~string((string *)&local_f50);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
      }
      pvVar13 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&cmdVar.field_2 + 8));
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)&__range1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ec8," ");
      std::operator+(&local_f70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     " ");
      std::__cxx11::string::insert((ulong)pvVar13,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_f70);
      std::__cxx11::string::~string((string *)&__range1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_ec8);
    }
  }
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&cmdVar.field_2 + 8));
  if (!bVar3) {
    pvVar13 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&cmdVar.field_2 + 8));
    std::__cxx11::string::insert((ulong)pvVar13,(string *)0x0);
  }
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&cmdVar.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar1);
  i_2 = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i_2);
    if (!bVar3) break;
    local_fb0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    std::operator+(&local_fd0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   local_fb0);
    std::__cxx11::string::operator=((string *)local_fb0,(string *)&local_fd0);
    std::__cxx11::string::~string((string *)&local_fd0);
    pcVar14 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                            *)((long)&tdi.field_2 + 8));
    pcVar8 = GetLocalGenerator(this);
    local_1318 = (cmOutputConverter *)0x0;
    if (pcVar8 != (cmLocalNinjaGenerator *)0x0) {
      local_1318 = &(pcVar8->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar14,local_1318,local_fb0,(RuleVariables *)auStack_128);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar8 = GetLocalGenerator(this);
  std::__cxx11::string::string((string *)&local_1010);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_ff0,pcVar8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cmdVar.field_2 + 8),&local_1010,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_ff0);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::__cxx11::string::~string((string *)&local_1010);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),"Rule for compiling ");
  std::__cxx11::string::operator+=
            ((string *)(rule.Description.field_2._M_local_buf + 8),(string *)vars.SwiftSources);
  std::__cxx11::string::operator+=((string *)(rule.Description.field_2._M_local_buf + 8)," files.");
  std::__cxx11::string::operator=((string *)(rule.Command.field_2._M_local_buf + 8),"Building ");
  std::__cxx11::string::operator+=
            ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)vars.SwiftSources);
  std::__cxx11::string::operator+=((string *)(rule.Command.field_2._M_local_buf + 8)," object $out")
  ;
  pcVar12 = GetGlobalGenerator(this);
  cmGlobalNinjaGenerator::AddRule(pcVar12,(cmNinjaRule *)local_908);
  std::__cxx11::string::~string((string *)(clauncher_prop.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&cmdVar.field_2 + 8));
  std::__cxx11::string::~string(local_968);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_908);
  std::__cxx11::string::~string((string *)&rule_1.Generator);
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)local_200);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)((long)&tdi.field_2 + 8));
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string(local_158);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (explicitPP) {
    cmNinjaRule rule(this->LanguagePreprocessRule(lang));
    // Explicit preprocessing always uses a depfile.
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = rule.DepFile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    if (!responseFlag.empty()) {
      rule.RspFile = "$RSP_FILE";
      rule.RspContent = " ";
      rule.RspContent += ppVars.Defines;
      rule.RspContent += " ";
      rule.RspContent += ppVars.Includes;
      rule.RspContent += " ";
      rule.RspContent += ppFlags;
      ppFlags = responseFlag + rule.RspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    {
      // Lookup the explicit preprocessing rule.
      std::string ppVar = "CMAKE_" + lang;
      ppVar += "_PREPROCESS_SOURCE";
      cmSystemTools::ExpandListArgument(
        this->GetMakefile()->GetRequiredDefinition(ppVar), ppCmds);
    }

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    {
      std::string ccmd = cmakeCmd;
      ccmd += " -E cmake_ninja_depends --tdi=";
      ccmd += tdi;
      ccmd += " --lang=";
      ccmd += lang;
      ccmd += " --pp=$out --dep=$DEP_FILE";
      if (needDyndep) {
        ccmd += " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
      }
      ppCmds.emplace_back(std::move(ccmd));
    }
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    rule.Comment = "Rule for preprocessing ";
    rule.Comment += lang;
    rule.Comment += " files.";
    rule.Description = "Building ";
    rule.Description += lang;
    rule.Description += " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmakeCmd;
        ccmd += " -E cmake_ninja_dyndep --tdi=";
        ccmd += tdi;
        ccmd += " --lang=";
        ccmd += lang;
        ccmd += " --dd=$out ";
        ccmd += "@";
        ccmd += rule.RspFile;
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command = this->GetLocalGenerator()->BuildCommandLine(ddCmds);
    }
    rule.Comment = "Rule to generate ninja dyndep files for ";
    rule.Comment += lang;
    rule.Comment += ".";
    rule.Description = "Generating ";
    rule.Description += lang;
    rule.Description += " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent = " ";
    rule.RspContent += vars.Defines;
    rule.RspContent += " ";
    rule.RspContent += vars.Includes;
    rule.RspContent += " ";
    rule.RspContent += flags;
    flags = responseFlag + rule.RspFile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    rule.DepType = "msvc";
    rule.DepFile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    rule.DepType = "gcc";
    rule.DepFile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = cmakeCmd;
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    if (!args.empty()) {
      args[0] = this->LocalGenerator->ConvertToOutputFormat(
        args[0], cmOutputConverter::SHELL);
      for (std::string& i : cmMakeRange(args.begin() + 1, args.end())) {
        i = this->LocalGenerator->EscapeForShell(i);
      }
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command = this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  rule.Comment = "Rule for compiling ";
  rule.Comment += lang;
  rule.Comment += " files.";
  rule.Description = "Building ";
  rule.Description += lang;
  rule.Description += " object $out";
  this->GetGlobalGenerator()->AddRule(rule);
}